

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O2

bool __thiscall
estl::state_machine<cdplayer>::test_transitions
          (state_machine<cdplayer> *this,test_vec_type *test_vector,bool print_failing)

{
  pointer ptVar1;
  state_type sVar2;
  ostream *poVar3;
  test_entry *tc;
  pointer ptVar4;
  bool bVar5;
  bool bVar6;
  
  ptVar1 = (test_vector->
           super__Vector_base<estl::state_machine<cdplayer>::test_entry,_std::allocator<estl::state_machine<cdplayer>::test_entry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = true;
  for (ptVar4 = (test_vector->
                super__Vector_base<estl::state_machine<cdplayer>::test_entry,_std::allocator<estl::state_machine<cdplayer>::test_entry>_>
                )._M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
    sVar2 = next_state(this,ptVar4->state_from,&ptVar4->inputs);
    bVar6 = sVar2 == ptVar4->state_to;
    if (bVar6 || !print_failing) {
      bVar5 = (bool)(bVar5 & bVar6);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"FAILED test: ");
      poVar3 = std::operator<<(poVar3,(string *)&ptVar4->description);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"Expected <> Found: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,ptVar4->state_to);
      poVar3 = std::operator<<(poVar3," != ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
      std::endl<char,std::char_traits<char>>(poVar3);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool test_transitions(const test_vec_type& test_vector, bool print_failing = false) const {
        // Test we have transistions for all states
        if (state_switches_.size() != states_count()) {
            if (print_failing) {
                std::cout   << "ERROR: Wrong number of transition functions:\n"
                            << "Expected <> Found:\n"
                            << states_count()
                            << " != " << state_switches_.size()
                            << std::endl;
            }
            return false;
        }

        // Run test cases
        bool all_ok = true;
        for (const test_entry& tc: test_vector) {
            const state_type state_from = tc.state_from;
            const inputs_type& inputs = tc.inputs;
            const auto out_state = next_state(state_from, inputs);
            if (out_state != tc.state_to) {
                all_ok = false;
                if (print_failing) {
                    std::cout   << "FAILED test: " << tc.description << "\n"
                                << "Expected <> Found: "
                                << static_cast<int32_t>(tc.state_to)
                                << " != " << static_cast<int32_t>(out_state)
                                << std::endl;
                }
            }
        }
        return all_ok;
    }